

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_CFunction lua_tocfunction(lua_State *L,int idx)

{
  uint uVar1;
  TValue *pTVar2;
  BCOp op;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2adr(L,idx);
  if (((int)(pTVar2->field_4).it >> 0xf == -9) &&
     ((uVar1 = **(uint **)((pTVar2->u64 & 0x7fffffffffff) + 0x20) & 0xff, uVar1 == 0x5f ||
      (uVar1 == 0x60)))) {
    L_local = *(lua_State **)((pTVar2->u64 & 0x7fffffffffff) + 0x28);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return (lua_CFunction)L_local;
}

Assistant:

LUA_API lua_CFunction lua_tocfunction(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisfunc(o)) {
    BCOp op = bc_op(*mref(funcV(o)->c.pc, BCIns));
    if (op == BC_FUNCC || op == BC_FUNCCW)
      return funcV(o)->c.f;
  }
  return NULL;
}